

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivToChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pOld;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x6ce,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar2);
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iVar3 = Gia_ObjFanin1Copy(pObj);
    uVar2 = Gia_ManHashAnd(pNew,iVar1,iVar3);
  }
  else {
    if ((~*(ulong *)pObj_00 & 0x1fffffff1fffffff) != 0) {
      Gia_ManEquivToChoices_rec(pNew,p,pObj_00);
      if (((int)(uint)*(undefined8 *)pObj < 0) ||
         (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6af,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar2);
      Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iVar3 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManHashAnd(pNew,iVar1,iVar3);
      pObj->Value = uVar2;
      iVar1 = Abc_LitRegular(uVar2);
      iVar3 = Abc_LitRegular(pObj_00->Value);
      if (iVar1 == iVar3) {
        uVar2 = pObj->Value;
        uVar4 = Abc_LitNotCond(pObj_00->Value,
                               ((uint)pObj ^ (uint)pObj_00) & 1 ^
                               (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >>
                                     0x3f) ^
                               (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >>
                                     0x3f));
        if (uVar2 == uVar4) {
          return;
        }
        __assert_fail("(int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) )"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6b5,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      uVar2 = pObj_00->Value;
      if (pObj->Value < uVar2) {
        return;
      }
      if (pObj->Value <= uVar2) {
        __assert_fail("pRepr->Value < pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6ba,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      iVar1 = Abc_Lit2Var(uVar2);
      pOld = Gia_ManObj(pNew,iVar1);
      iVar1 = Abc_Lit2Var(pObj->Value);
      pGVar5 = Gia_ManObj(pNew,iVar1);
      iVar1 = Gia_ObjId(pNew,pGVar5);
      pGVar6 = Gia_ObjReprObj(pNew,iVar1);
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        iVar1 = Gia_ObjCheckTfi(pNew,pOld,pGVar5);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjId(pNew,pGVar5);
          if (pNew->pNexts[iVar1] != 0) {
            __assert_fail("Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x6c7,
                          "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar1 = Gia_ObjId(pNew,pGVar5);
          iVar3 = Gia_ObjId(pNew,pOld);
          Gia_ObjSetRepr(pNew,iVar1,iVar3);
          Gia_ManAddNextEntry_rec(pNew,pOld,pGVar5);
        }
      }
      else {
        iVar1 = Gia_ObjId(pNew,pGVar5);
        pGVar5 = Gia_ObjReprObj(pNew,iVar1);
        if (pGVar5 != pOld) {
          return;
        }
      }
    }
    uVar2 = Abc_LitNotCond(pObj_00->Value,
                           ((uint)pObj_00 ^ (uint)pObj) & 1 ^
                           (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f)
                           ^ (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >>
                                   0x3f));
  }
  pObj->Value = uVar2;
  return;
}

Assistant:

void Gia_ManEquivToChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr, * pReprNew, * pObjNew;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        if ( Gia_ObjIsConst0(pRepr) )
        {
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        Gia_ManEquivToChoices_rec( pNew, p, pRepr );
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Abc_LitRegular(pObj->Value) == Abc_LitRegular(pRepr->Value) )
        {
            assert( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) ) );
            return;
        }
        if ( pRepr->Value > pObj->Value ) // should never happen with high resource limit
            return;
        assert( pRepr->Value < pObj->Value );
        pReprNew = Gia_ManObj( pNew, Abc_Lit2Var(pRepr->Value) );
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) )
        {
//            assert( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) == pReprNew );
            if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) != pReprNew )
                return;
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        if ( !Gia_ObjCheckTfi( pNew, pReprNew, pObjNew ) )
        {
            assert( Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0 );
            Gia_ObjSetRepr( pNew, Gia_ObjId(pNew, pObjNew), Gia_ObjId(pNew, pReprNew) );
            Gia_ManAddNextEntry_rec( pNew, pReprNew, pObjNew );
        }
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}